

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response_parser.cc
# Opt level: O0

void __thiscall iqxmlrpc::ResponseBuilder::ResponseBuilder(ResponseBuilder *this,Parser *parser)

{
  Parser *parser_local;
  ResponseBuilder *this_local;
  
  BuilderBase::BuilderBase(&this->super_BuilderBase,parser,false);
  (this->super_BuilderBase)._vptr_BuilderBase = (_func_int **)&PTR_do_visit_element_00254300;
  StateMachine::StateMachine(&this->state_,parser,0);
  boost::optional<iqxmlrpc::Value>::optional(&this->ok_);
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::optional(&this->fault_str_);
  StateMachine::set_transitions(&this->state_,ResponseBuilder::trans);
  return;
}

Assistant:

ResponseBuilder::ResponseBuilder(Parser& parser):
  BuilderBase(parser),
  state_(parser, NONE)
{
  static const StateMachine::StateTransition trans[] = {
    { NONE, RESPONSE, "methodResponse" },
    { RESPONSE, OK_RESPONSE, "params" },
    { OK_RESPONSE, OK_PARAM, "param" },
    { OK_PARAM, OK_PARAM_VALUE, "value" },
    { RESPONSE, FAULT_RESPONSE, "fault" },
    { FAULT_RESPONSE, FAULT_RESPONSE_VALUE, "value" },
    { 0, 0, 0 }
  };
  state_.set_transitions(trans);
}